

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CArena.cpp
# Opt level: O3

void * __thiscall amrex::CArena::alloc(CArena *this,size_t nbytes)

{
  _Rb_tree_header *__position;
  NL *this_00;
  pointer *pppVar1;
  iterator __position_00;
  int iVar2;
  _Base_ptr p_Var3;
  const_iterator __position_01;
  _Base_ptr p_Var4;
  undefined8 uVar5;
  _Base_ptr nbytes_00;
  __node_gen_type __node_gen;
  Node freeblock;
  _Alloc_node local_58;
  pthread_mutex_t *local_50;
  Node local_48;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->carena_mutex);
  if (iVar2 == 0) {
    local_50 = (pthread_mutex_t *)&this->carena_mutex;
    p_Var3 = (_Base_ptr)Arena::align(nbytes + (nbytes == 0));
    if ((this->super_Arena).arena_info.release_threshold <=
        (long)((long)&p_Var3->_M_color + this->m_used)) {
      freeUnused_protected(this);
    }
    __position = &(this->m_freelist)._M_t._M_impl.super__Rb_tree_header;
    for (__position_01._M_node =
              (this->m_freelist)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        ((_Rb_tree_header *)__position_01._M_node != __position &&
        (__position_01._M_node[1]._M_left < p_Var3));
        __position_01._M_node = (_Base_ptr)std::_Rb_tree_increment(__position_01._M_node)) {
    }
    this_00 = &this->m_freelist;
    if ((_Rb_tree_header *)__position_01._M_node == __position) {
      nbytes_00 = (_Base_ptr)this->m_hunk;
      if ((_Base_ptr)this->m_hunk < p_Var3) {
        nbytes_00 = p_Var3;
      }
      p_Var4 = (_Base_ptr)Arena::allocate_system(&this->super_Arena,(size_t)nbytes_00);
      this->m_used = (long)&nbytes_00->_M_color + this->m_used;
      __position_00._M_current =
           (this->m_alloc).
           super__Vector_base<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->m_alloc).
          super__Vector_base<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_48.m_block = p_Var4;
        local_48.m_owner = nbytes_00;
        std::vector<std::pair<void*,unsigned_long>,std::allocator<std::pair<void*,unsigned_long>>>::
        _M_realloc_insert<std::pair<void*,unsigned_long>>
                  ((vector<std::pair<void*,unsigned_long>,std::allocator<std::pair<void*,unsigned_long>>>
                    *)&this->m_alloc,__position_00,(pair<void_*,_unsigned_long> *)&local_48);
      }
      else {
        (__position_00._M_current)->first = p_Var4;
        (__position_00._M_current)->second = (unsigned_long)nbytes_00;
        pppVar1 = &(this->m_alloc).
                   super__Vector_base<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + 1;
      }
      local_48.m_size = (long)this->m_hunk - (long)p_Var3;
      if (p_Var3 <= (_Base_ptr)this->m_hunk && local_48.m_size != 0) {
        local_48.m_block = (void *)((long)&p_Var3->_M_color + (long)&p_Var4->_M_color);
        local_58._M_t = &this_00->_M_t;
        local_48.m_owner = p_Var4;
        std::
        _Rb_tree<amrex::CArena::Node,amrex::CArena::Node,std::_Identity<amrex::CArena::Node>,std::less<amrex::CArena::Node>,std::allocator<amrex::CArena::Node>>
        ::
        _M_insert_unique_<amrex::CArena::Node,std::_Rb_tree<amrex::CArena::Node,amrex::CArena::Node,std::_Identity<amrex::CArena::Node>,std::less<amrex::CArena::Node>,std::allocator<amrex::CArena::Node>>::_Alloc_node>
                  ((_Rb_tree<amrex::CArena::Node,amrex::CArena::Node,std::_Identity<amrex::CArena::Node>,std::less<amrex::CArena::Node>,std::allocator<amrex::CArena::Node>>
                    *)this_00,(const_iterator)__position,&local_48,&local_58);
      }
      local_58._M_t =
           (_Rb_tree<amrex::CArena::Node,_amrex::CArena::Node,_std::_Identity<amrex::CArena::Node>,_std::less<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
            *)&this->m_busylist;
      local_48.m_block = p_Var4;
      local_48.m_owner = p_Var4;
      local_48.m_size = (size_t)p_Var3;
      std::
      _Hashtable<amrex::CArena::Node,amrex::CArena::Node,std::allocator<amrex::CArena::Node>,std::__detail::_Identity,std::equal_to<amrex::CArena::Node>,amrex::CArena::Node::hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<amrex::CArena::Node,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<amrex::CArena::Node,false>>>>
                ();
    }
    else {
      p_Var4 = *(_Base_ptr *)(__position_01._M_node + 1);
      local_58._M_t =
           (_Rb_tree<amrex::CArena::Node,_amrex::CArena::Node,_std::_Identity<amrex::CArena::Node>,_std::less<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
            *)&this->m_busylist;
      local_48.m_owner = __position_01._M_node[1]._M_parent;
      local_48.m_block = p_Var4;
      local_48.m_size = (size_t)p_Var3;
      std::
      _Hashtable<amrex::CArena::Node,amrex::CArena::Node,std::allocator<amrex::CArena::Node>,std::__detail::_Identity,std::equal_to<amrex::CArena::Node>,amrex::CArena::Node::hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<amrex::CArena::Node,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<amrex::CArena::Node,false>>>>
                ();
      if (p_Var3 < __position_01._M_node[1]._M_left) {
        local_48.m_owner = __position_01._M_node[1]._M_parent;
        local_48.m_size = (long)__position_01._M_node[1]._M_left - (long)p_Var3;
        local_48.m_block = (void *)((long)&p_Var4->_M_color + (long)&p_Var3->_M_color);
        local_58._M_t = &this_00->_M_t;
        std::
        _Rb_tree<amrex::CArena::Node,amrex::CArena::Node,std::_Identity<amrex::CArena::Node>,std::less<amrex::CArena::Node>,std::allocator<amrex::CArena::Node>>
        ::
        _M_insert_unique_<amrex::CArena::Node_const&,std::_Rb_tree<amrex::CArena::Node,amrex::CArena::Node,std::_Identity<amrex::CArena::Node>,std::less<amrex::CArena::Node>,std::allocator<amrex::CArena::Node>>::_Alloc_node>
                  ((_Rb_tree<amrex::CArena::Node,amrex::CArena::Node,std::_Identity<amrex::CArena::Node>,std::less<amrex::CArena::Node>,std::allocator<amrex::CArena::Node>>
                    *)this_00,__position_01,&local_48,&local_58);
      }
      std::
      _Rb_tree<amrex::CArena::Node,amrex::CArena::Node,std::_Identity<amrex::CArena::Node>,std::less<amrex::CArena::Node>,std::allocator<amrex::CArena::Node>>
      ::erase_abi_cxx11_((_Rb_tree<amrex::CArena::Node,amrex::CArena::Node,std::_Identity<amrex::CArena::Node>,std::less<amrex::CArena::Node>,std::allocator<amrex::CArena::Node>>
                          *)this_00,__position_01);
    }
    this->m_actually_used = (long)&p_Var3->_M_color + this->m_actually_used;
    pthread_mutex_unlock(local_50);
    return p_Var4;
  }
  uVar5 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock(local_50);
  _Unwind_Resume(uVar5);
}

Assistant:

void*
CArena::alloc (std::size_t nbytes)
{
    std::lock_guard<std::mutex> lock(carena_mutex);

    nbytes = Arena::align(nbytes == 0 ? 1 : nbytes);

    if (static_cast<Long>(m_used+nbytes) >= arena_info.release_threshold) {
        freeUnused_protected();
    }

    //
    // Find node in freelist at lowest memory address that'll satisfy request.
    //
    NL::iterator free_it = m_freelist.begin();

    for ( ; free_it != m_freelist.end(); ++free_it) {
        if ((*free_it).size() >= nbytes) {
            break;
        }
    }

    void* vp = 0;

    if (free_it == m_freelist.end())
    {
        const std::size_t N = nbytes < m_hunk ? m_hunk : nbytes;

        vp = allocate_system(N);

        m_used += N;

        m_alloc.push_back(std::make_pair(vp,N));

        if (nbytes < m_hunk)
        {
            //
            // Add leftover chunk to free list.
            //
            // Insert with a hint -- should be largest block in the set.
            //
            void* block = static_cast<char*>(vp) + nbytes;

            m_freelist.insert(m_freelist.end(), Node(block, vp, m_hunk-nbytes));
        }

        m_busylist.insert(Node(vp, vp, nbytes));
    }
    else
    {
        BL_ASSERT((*free_it).size() >= nbytes);
        BL_ASSERT(m_busylist.find(*free_it) == m_busylist.end());

        vp = (*free_it).block();
        m_busylist.insert(Node(vp, free_it->owner(), nbytes));

        if ((*free_it).size() > nbytes)
        {
            //
            // Insert remainder of free block back into freelist.
            //
            // Insert with a hint -- right after the current block being split.
            //
            Node freeblock = *free_it;

            freeblock.size(freeblock.size() - nbytes);

            freeblock.block(static_cast<char*>(vp) + nbytes);

            m_freelist.insert(free_it, freeblock);
        }

        m_freelist.erase(free_it);
    }

    m_actually_used += nbytes;

    BL_ASSERT(!(vp == 0));

    return vp;
}